

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O0

void __thiscall ProblemDecTiger::FillTransitionModel(ProblemDecTiger *this)

{
  double dVar1;
  long *in_RDI;
  Index ja;
  Index s2;
  Index s1;
  double in_stack_ffffffffffffffd8;
  Index sucSI;
  Index in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff0;
  uint uVar2;
  
  for (uVar2 = 0; (ulong)uVar2 < (ulong)in_RDI[0x44]; uVar2 = uVar2 + 1) {
    for (in_stack_fffffffffffffff0 = 0; (ulong)in_stack_fffffffffffffff0 < (ulong)in_RDI[0x44];
        in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
      in_stack_ffffffffffffffec = 0;
      while( true ) {
        in_stack_ffffffffffffffd8 = (double)(ulong)in_stack_ffffffffffffffec;
        dVar1 = (double)(**(code **)(*in_RDI + 0x70))();
        if ((ulong)dVar1 <= (ulong)in_stack_ffffffffffffffd8) break;
        MultiAgentDecisionProcessDiscrete::SetTransitionProbability
                  ((MultiAgentDecisionProcessDiscrete *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (Index)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
        in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1;
      }
    }
  }
  MultiAgentDecisionProcessDiscrete::SetTransitionProbability
            ((MultiAgentDecisionProcessDiscrete *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(Index)((ulong)in_RDI >> 0x20),
             in_stack_ffffffffffffffd8);
  sucSI = (Index)((ulong)in_RDI >> 0x20);
  MultiAgentDecisionProcessDiscrete::SetTransitionProbability
            ((MultiAgentDecisionProcessDiscrete *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,sucSI,in_stack_ffffffffffffffd8);
  MultiAgentDecisionProcessDiscrete::SetTransitionProbability
            ((MultiAgentDecisionProcessDiscrete *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,sucSI,in_stack_ffffffffffffffd8);
  MultiAgentDecisionProcessDiscrete::SetTransitionProbability
            ((MultiAgentDecisionProcessDiscrete *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,sucSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ProblemDecTiger::FillTransitionModel()
{
    // add transitions:
    for(Index s1=0; s1<NUMBER_OF_STATES;s1++) 
        for(Index s2=0; s2<NUMBER_OF_STATES;s2++) 
            for(Index ja=0; ja<GetNrJointActions(); ja++)
            {
                if(DEBUG_TM)    cout << "ProblemDecTiger::FillTransitionModel() - calling SetTransitionProbability("<<s1<<", "<<ja<<", "<<s2<<", 0.5)"<<endl;
                SetTransitionProbability(s1, ja, s2, 0.5);
        
                if(DEBUG_TM)    cout << " - GetTransitionProb gives " << GetTransitionProbability(s1, ja, s2) << endl;
            }
    SetTransitionProbability(SLEFT, LISTEN_LISTEN, SLEFT, 1.0);
    SetTransitionProbability(SLEFT, LISTEN_LISTEN, SRIGHT, 0.0);
    SetTransitionProbability(SRIGHT, LISTEN_LISTEN, SRIGHT, 1.0);
    SetTransitionProbability(SRIGHT, LISTEN_LISTEN, SLEFT, 0.0);
}